

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

bool __thiscall NDevice::isValid(NDevice *this)

{
  bool bVar1;
  long lVar2;
  const_reference this_00;
  bool bVar3;
  int i;
  size_type __n;
  
  bVar3 = false;
  if ((((this->name)._M_string_length != 0) && (bVar3 = false, this->numBytes != -1)) &&
     (this->byteOffset != -1)) {
    if ((this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl
        .super__Vector_impl_data._M_start ==
        (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      bVar3 = false;
    }
    else {
      __n = 0;
      do {
        lVar2 = (long)(int)((ulong)((long)(this->channels).
                                          super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->channels).
                                         super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 6);
        bVar3 = lVar2 <= (long)__n;
        if (lVar2 <= (long)__n) {
          return bVar3;
        }
        this_00 = std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::at
                            (&this->channels,__n);
        bVar1 = NDeviceChannel::isValid(this_00);
        __n = __n + 1;
      } while (bVar1);
    }
  }
  return bVar3;
}

Assistant:

bool NDevice::isValid() const {
    if (name.empty() || numBytes == -1 || byteOffset == -1 || channels.empty())
        return(false); // a device must have a name, a set numBytes, a set byteOffset, and at least one channel
    for (int i = 0; i < (int)channels.size(); i++) {
        if (!channels.at(i).isValid()) //make sure all channels are valid
            return(false);
    }
    return(true);
}